

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

ValueCallback *
ValueCallback::findCallback
          (deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,OIDType *oid,
          bool walk,size_t startAt,size_t *foundAt)

{
  long lVar1;
  ValueCallback *pVVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  ulong uVar6;
  long *plVar7;
  pointer puVar8;
  ulong uVar9;
  uchar *puVar10;
  size_t i;
  
  bVar5 = false;
  do {
    lVar1 = *(long *)(callbacks + 0x10);
    if ((*(long *)(callbacks + 0x20) - lVar1 >> 3) +
        (*(long *)(callbacks + 0x30) - *(long *)(callbacks + 0x38) >> 3) +
        ((((ulong)(*(long *)(callbacks + 0x48) - *(long *)(callbacks + 0x28)) >> 3) - 1) +
        (ulong)(*(long *)(callbacks + 0x48) == 0)) * 0x40 <= startAt) {
      return (ValueCallback *)0x0;
    }
    uVar6 = (lVar1 - *(long *)(callbacks + 0x18) >> 3) + startAt;
    if ((long)uVar6 < 0) {
      uVar9 = (long)uVar6 >> 6;
LAB_0016d5e2:
      plVar7 = (long *)((uVar6 + uVar9 * -0x40) * 8 +
                       *(long *)(*(long *)(callbacks + 0x28) + uVar9 * 8));
    }
    else {
      if (0x3f < uVar6) {
        uVar9 = uVar6 >> 6;
        goto LAB_0016d5e2;
      }
      plVar7 = (long *)(lVar1 + startAt * 8);
    }
    pVVar2 = (ValueCallback *)*plVar7;
    if (bVar5 != false) {
LAB_0016d668:
      if (foundAt == (size_t *)0x0) {
        return pVVar2;
      }
      *foundAt = startAt;
      return pVVar2;
    }
    bVar5 = OIDType::equals(oid,&pVVar2->OID->super_OIDType);
    if (bVar5) {
      if (!walk) goto LAB_0016d668;
    }
    else if (walk) {
      puVar3 = (oid->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start;
      puVar8 = (oid->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish;
      puVar4 = (pVVar2->OID->super_OIDType).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)puVar8 - (long)puVar3) <
          (ulong)((long)(pVVar2->OID->super_OIDType).data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4)) {
        if (puVar8 == puVar3) goto LAB_0016d668;
        puVar10 = puVar8 + (long)(puVar4 + ~(ulong)puVar3);
        while (puVar8[-1] == *puVar10) {
          puVar8 = puVar8 + -1;
          puVar10 = puVar10 + -1;
          if (puVar8 == puVar3) goto LAB_0016d668;
        }
      }
    }
    startAt = startAt + 1;
  } while( true );
}

Assistant:

ValueCallback* ValueCallback::findCallback(std::deque<ValueCallback*> &callbacks, const OIDType* const oid, bool walk, size_t startAt, size_t *foundAt){
    bool useNext = false;

    for(size_t i = startAt; i < callbacks.size(); i++){
        auto callback = callbacks[i];

        if(useNext){
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(oid->equals(callback->OID)){
            if(walk){
                useNext = true;
                continue;
            }
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }

        if(walk && callback->OID->isSubTreeOf(oid)){
            // If the oid passed in is a substring of our current callback, and it begins at the start
            if(foundAt){
                *foundAt = i;
            }
            return callback;
        }
    }
    return nullptr;
}